

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSet<char16_t>::SetRange
          (CharSet<char16_t> *this,ArenaAllocator *allocator,Char lc,Char hc)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar8;
  CharSetInner *this_00;
  undefined4 extraout_var;
  TrackAllocData local_50;
  uint local_28;
  uint local_24;
  uint i;
  uint h;
  uint l;
  Char hc_local;
  Char lc_local;
  ArenaAllocator *allocator_local;
  CharSet<char16_t> *this_local;
  
  h._0_2_ = hc;
  h._2_2_ = lc;
  _l = &allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  allocator_local = (ArenaAllocator *)this;
  i = Chars<char16_t>::CTU(lc);
  local_24 = Chars<char16_t>::CTU((Char)h);
  if (i <= local_24) {
    bVar4 = IsCompact(this);
    if (bVar4) {
      if (local_24 - i < 4) {
        do {
          local_28 = 0;
          while ((uVar3 = local_28, uVar5 = GetCompactLength(this), uVar3 < uVar5 &&
                 (((0xffff < i || (3 < local_28)) ||
                  (uVar5 = GetCompactCharU(this,local_28), uVar5 != i))))) {
            local_28 = local_28 + 1;
          }
          uVar3 = local_28;
          uVar5 = GetCompactLength(this);
          if (uVar3 == uVar5) {
            if (3 < local_28) break;
            AddCompactCharU(this,i);
          }
          i = i + 1;
        } while (i <= local_24);
        if (local_24 < i) {
          return;
        }
      }
      SwitchRepresentations(this,(ArenaAllocator *)_l);
    }
    bVar4 = IsCompact(this);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                         ,1099,"(!IsCompact())","!IsCompact()");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    if ((i == 0) && (local_24 == 0xffff)) {
      CharBitvec::SetRange(&(this->rep).full.direct,0,0xff);
      if ((this->rep).compact.countPlusOne != 0) {
        pCVar1 = (this->rep).full.root;
        (**pCVar1->_vptr_CharSetNode)(pCVar1,_l);
      }
      (this->rep).full.root = (CharSetNode *)&CharSetFull::Instance;
    }
    else {
      if (i < 0x100) {
        if (local_24 < 0x100) {
          CharBitvec::SetRange(&(this->rep).full.direct,i,local_24);
          return;
        }
        CharBitvec::SetRange(&(this->rep).full.direct,i,0xff);
        i = 0x100;
      }
      pAVar8 = _l;
      if ((this->rep).compact.countPlusOne == 0) {
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_50,(type_info *)&CharSetInner::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                   ,0x462);
        pAVar8 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar8,&local_50);
        this_00 = (CharSetInner *)
                  new<Memory::ArenaAllocator>(0x88,(ArenaAllocator *)pAVar8,0x3f67b0);
        CharSetInner::CharSetInner(this_00);
        (this->rep).full.root = (CharSetNode *)this_00;
      }
      pCVar1 = (this->rep).full.root;
      iVar6 = (*pCVar1->_vptr_CharSetNode[2])(pCVar1,_l,2,(ulong)i,(ulong)local_24);
      (this->rep).compact.countPlusOne = CONCAT44(extraout_var,iVar6);
    }
  }
  return;
}

Assistant:

void CharSet<char16>::SetRange(ArenaAllocator* allocator, Char lc, Char hc)
    {
        uint l = CTU(lc);
        uint h = CTU(hc);
        if (h < l)
            return;

        if (IsCompact())
        {
            if (h - l < MaxCompact)
            {
                do
                {
                    uint i;
                    for (i = 0; i < this->GetCompactLength(); i++)
                    {
                        __assume(l <= MaxUChar);
                        if (l <= MaxUChar && i < MaxCompact)
                        {
                            if (this->GetCompactCharU(i) == l)
                                break;
                        }
                    }
                    if (i == this->GetCompactLength())
                    {
                        // Character not already in compact set
                        if (i < MaxCompact)
                        {
                            this->AddCompactCharU(l);
                        }
                        else
                            // Must switch representations
                            break;
                    }
                    l++;
                }
                while (l <= h);
                if (h < l)
                    // All chars are now in compact set
                    return;
                // else: fall-through to general case for remaining chars
            }
            // else: no use even trying

            SwitchRepresentations(allocator);
        }

        Assert(!IsCompact());

        if (l == 0 && h == MaxUChar)
        {
            rep.full.direct.SetRange(0, CharSetNode::directSize - 1);
            if (rep.full.root != nullptr)
                rep.full.root->FreeSelf(allocator);
            rep.full.root = CharSetFull::TheFullNode;
        }
        else
        {
            if (l < CharSetNode::directSize)
            {
                if (h < CharSetNode::directSize)
                {
                    rep.full.direct.SetRange(l, h);
                    return;
                }
                rep.full.direct.SetRange(l, CharSetNode::directSize - 1);
                l = CharSetNode::directSize;
            }

            if (rep.full.root == nullptr)
                rep.full.root = Anew(allocator, CharSetInner);
            rep.full.root = rep.full.root->Set(allocator, CharSetNode::levels - 1, l, h);
        }
    }